

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

TimerId __thiscall
sznet::net::EventLoop::runEvery(EventLoop *this,double interval,TimerCallback *cb)

{
  TimerQueue *this_00;
  _Manager_type p_Var1;
  Timestamp TVar2;
  TimerId TVar3;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  double local_20;
  
  local_20 = interval;
  TVar2 = Timestamp::now();
  TVar2 = addTime(TVar2,local_20);
  this_00 = (this->m_timerQueue)._M_t.
            super___uniq_ptr_impl<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>._M_t.
            super__Tuple_impl<0UL,_sznet::TimerQueue_*,_std::default_delete<sznet::TimerQueue>_>.
            super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl;
  local_38 = (_Manager_type)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  TVar3 = TimerQueue::addTimer(this_00,(TimerCallback *)&local_48,TVar2,local_20);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return TVar3;
}

Assistant:

TimerId EventLoop::runEvery(double interval, TimerCallback cb)
{
	Timestamp time(addTime(Timestamp::now(), interval));
	return m_timerQueue->addTimer(std::move(cb), time, interval);
}